

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

QSize __thiscall QTabBar::minimumTabSizeHint(QTabBar *this,int index)

{
  Tab *this_00;
  const_reference ppTVar1;
  undefined4 in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  Tab *tab;
  QTabBarPrivate *d;
  QString oldText;
  QSize size;
  QString *in_stack_ffffffffffffff78;
  QString *other;
  QList<QTabBarPrivate::Tab_*> *in_stack_ffffffffffffff80;
  QString *this_01;
  QString *text;
  undefined8 in_stack_ffffffffffffff98;
  TextElideMode mode;
  QString local_40;
  QString local_28;
  QSize local_10;
  long local_8;
  
  mode = (TextElideMode)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTabBar *)0x6aee84);
  ppTVar1 = QList<QTabBarPrivate::Tab_*>::at
                      (in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
  this_00 = *ppTVar1;
  this_01 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  text = &local_28;
  QString::QString((QString *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffff78);
  other = &local_40;
  computeElidedText(mode,text);
  QString::operator=(this_01,other);
  QString::~QString((QString *)0x6aef10);
  this_00->field_0xe4 = this_00->field_0xe4 | 4;
  local_10 = (QSize)this_01;
  local_10 = (QSize)(**(code **)(*in_RDI + 0x1a0))(in_RDI,in_ESI);
  QString::operator=(&this_00->text,(QString *)text);
  this_00->field_0xe4 = this_00->field_0xe4 & 0xfb;
  QString::~QString((QString *)0x6aef75);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QTabBar::minimumTabSizeHint(int index) const
{
    Q_D(const QTabBar);
    QTabBarPrivate::Tab *tab = d->tabList.at(index);
    QString oldText = tab->text;
    tab->text = computeElidedText(d->elideMode, oldText);
    tab->measuringMinimum = true;
    QSize size = tabSizeHint(index);
    tab->text = oldText;
    tab->measuringMinimum = false;
    return size;
}